

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::Cord::PrependPrecise(Cord *this,string_view src,MethodIdentifier method)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  char *pcVar5;
  const_pointer __src;
  Nullable<const_char_*> __src_00;
  Nonnull<CordRep_*> tree;
  string_view data_00;
  undefined1 local_40 [8];
  InlineData data;
  size_t cur_size;
  MethodIdentifier method_local;
  Cord *this_local;
  string_view src_local;
  
  src_local._M_len = (size_t)src._M_str;
  this_local = (Cord *)src._M_len;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!src.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x289,"void absl::Cord::PrependPrecise(absl::string_view, MethodIdentifier)");
  }
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar3 < 0xff4) {
    sVar4 = InlineRep::remaining_inline_capacity(&this->contents_);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (sVar4 < sVar3) {
      data_00._M_str = (char *)0x0;
      data_00._M_len = src_local._M_len;
      tree = &cord_internal::CordRepFlat::Create((CordRepFlat *)this_local,data_00,sVar3)->
              super_CordRep;
      InlineRep::PrependTree(&this->contents_,tree,method);
    }
    else {
      data.rep_.field_0.as_tree.rep = (CordRep *)InlineRep::inline_size(&this->contents_);
      cord_internal::InlineData::InlineData((InlineData *)local_40);
      uVar1 = data.rep_.field_0.as_tree.rep;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      cord_internal::InlineData::set_inline_size
                ((InlineData *)local_40,(size_t)(((CordRep *)uVar1)->storage + (sVar3 - 0xd)));
      pcVar5 = cord_internal::InlineData::as_chars((InlineData *)local_40);
      __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      memcpy(pcVar5,__src,sVar3);
      pcVar5 = cord_internal::InlineData::as_chars((InlineData *)local_40);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      __src_00 = InlineRep::data(&this->contents_);
      memcpy(pcVar5 + sVar3,__src_00,(size_t)data.rep_.field_0.as_tree.rep);
      cord_internal::InlineData::operator=((InlineData *)this,(InlineData *)local_40);
    }
    return;
  }
  __assert_fail("src.size() <= cord_internal::kMaxFlatLength",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x28a,"void absl::Cord::PrependPrecise(absl::string_view, MethodIdentifier)");
}

Assistant:

void Cord::PrependPrecise(absl::string_view src, MethodIdentifier method) {
  assert(!src.empty());
  assert(src.size() <= cord_internal::kMaxFlatLength);
  if (contents_.remaining_inline_capacity() >= src.size()) {
    const size_t cur_size = contents_.inline_size();
    InlineData data;
    data.set_inline_size(cur_size + src.size());
    memcpy(data.as_chars(), src.data(), src.size());
    memcpy(data.as_chars() + src.size(), contents_.data(), cur_size);
    contents_.data_ = data;
  } else {
    contents_.PrependTree(CordRepFlat::Create(src), method);
  }
}